

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O1

SRC_ERROR prepare_data(SINC_FILTER *filter,int channels,SRC_DATA *data,int half_filter_chan_len)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  if ((filter->b_real_end < 0) && (data->data_in != (float *)0x0)) {
    iVar4 = filter->b_current;
    if ((long)iVar4 == 0) {
      filter->b_end = half_filter_chan_len;
      filter->b_current = half_filter_chan_len;
      iVar4 = filter->b_len + half_filter_chan_len * -2;
    }
    else if (half_filter_chan_len + channels + filter->b_end < filter->b_len) {
      iVar1 = filter->b_len - (iVar4 + half_filter_chan_len);
      iVar4 = 0;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
    }
    else {
      iVar1 = (filter->b_end - iVar4) + half_filter_chan_len;
      memmove(filter->buffer,filter->buffer + ((long)iVar4 - (long)half_filter_chan_len),
              (long)iVar1 * 4);
      filter->b_current = half_filter_chan_len;
      filter->b_end = iVar1;
      iVar1 = filter->b_len + half_filter_chan_len * -2;
      iVar4 = 0;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
    }
    iVar1 = (int)filter->in_count - (int)filter->in_used;
    if (iVar4 < iVar1) {
      iVar1 = iVar4;
    }
    uVar3 = iVar1 - iVar1 % channels;
    if ((int)uVar3 < 0) {
      return SRC_ERR_SINC_PREPARE_DATA_BAD_LEN;
    }
    if (filter->b_len < (int)(filter->b_end + uVar3)) {
      return SRC_ERR_SINC_PREPARE_DATA_BAD_LEN;
    }
    memcpy(filter->buffer + filter->b_end,data->data_in + filter->in_used,(ulong)uVar3 * 4);
    iVar4 = uVar3 + filter->b_end;
    filter->b_end = iVar4;
    lVar2 = (ulong)uVar3 + filter->in_used;
    filter->in_used = lVar2;
    if (lVar2 == filter->in_count) {
      iVar1 = iVar4 - filter->b_current;
      if (SBORROW4(iVar1,half_filter_chan_len * 2) != iVar1 + half_filter_chan_len * -2 < 0) {
        if (data->end_of_input == 0) {
          return SRC_ERR_NO_ERROR;
        }
        iVar5 = half_filter_chan_len + 5;
        if (filter->b_len - iVar4 < iVar5) {
          memmove(filter->buffer,
                  filter->buffer + ((long)filter->b_current - (long)half_filter_chan_len),
                  (long)(iVar1 + half_filter_chan_len) * 4);
          filter->b_current = half_filter_chan_len;
          filter->b_end = iVar1 + half_filter_chan_len;
        }
        iVar4 = filter->b_end;
        filter->b_real_end = iVar4;
        if ((half_filter_chan_len < -5) || (filter->b_len < iVar4 + iVar5)) {
          iVar5 = filter->b_len - iVar4;
        }
        memset(filter->buffer + iVar4,0,(long)iVar5 * 4);
        filter->b_end = filter->b_end + iVar5;
        return SRC_ERR_NO_ERROR;
      }
    }
  }
  return SRC_ERR_NO_ERROR;
}

Assistant:

static SRC_ERROR
prepare_data (SINC_FILTER *filter, int channels, SRC_DATA *data, int half_filter_chan_len)
{	int len = 0 ;

	if (filter->b_real_end >= 0)
		return SRC_ERR_NO_ERROR ;	/* Should be terminating. Just return. */

	if (data->data_in == NULL)
		return SRC_ERR_NO_ERROR ;

	if (filter->b_current == 0)
	{	/* Initial state. Set up zeros at the start of the buffer and
		** then load new data after that.
		*/
		len = filter->b_len - 2 * half_filter_chan_len ;

		filter->b_current = filter->b_end = half_filter_chan_len ;
		}
	else if (filter->b_end + half_filter_chan_len + channels < filter->b_len)
	{	/*  Load data at current end position. */
		len = MAX (filter->b_len - filter->b_current - half_filter_chan_len, 0) ;
		}
	else
	{	/* Move data at end of buffer back to the start of the buffer. */
		len = filter->b_end - filter->b_current ;
		memmove (filter->buffer, filter->buffer + filter->b_current - half_filter_chan_len,
						(half_filter_chan_len + len) * sizeof (filter->buffer [0])) ;

		filter->b_current = half_filter_chan_len ;
		filter->b_end = filter->b_current + len ;

		/* Now load data at current end of buffer. */
		len = MAX (filter->b_len - filter->b_current - half_filter_chan_len, 0) ;
		} ;

	len = MIN ((int) (filter->in_count - filter->in_used), len) ;
	len -= (len % channels) ;

	if (len < 0 || filter->b_end + len > filter->b_len)
		return SRC_ERR_SINC_PREPARE_DATA_BAD_LEN ;

	memcpy (filter->buffer + filter->b_end, data->data_in + filter->in_used,
						len * sizeof (filter->buffer [0])) ;

	filter->b_end += len ;
	filter->in_used += len ;

	if (filter->in_used == filter->in_count &&
			filter->b_end - filter->b_current < 2 * half_filter_chan_len && data->end_of_input)
	{	/* Handle the case where all data in the current buffer has been
		** consumed and this is the last buffer.
		*/

		if (filter->b_len - filter->b_end < half_filter_chan_len + 5)
		{	/* If necessary, move data down to the start of the buffer. */
			len = filter->b_end - filter->b_current ;
			memmove (filter->buffer, filter->buffer + filter->b_current - half_filter_chan_len,
							(half_filter_chan_len + len) * sizeof (filter->buffer [0])) ;

			filter->b_current = half_filter_chan_len ;
			filter->b_end = filter->b_current + len ;
			} ;

		filter->b_real_end = filter->b_end ;
		len = half_filter_chan_len + 5 ;

		if (len < 0 || filter->b_end + len > filter->b_len)
			len = filter->b_len - filter->b_end ;

		memset (filter->buffer + filter->b_end, 0, len * sizeof (filter->buffer [0])) ;
		filter->b_end += len ;
		} ;

	return SRC_ERR_NO_ERROR ;
}